

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t
exr_attr_set_compression(exr_context_t ctxt,int part_index,char *name,exr_compression_t cval)

{
  pthread_mutex_t *__mutex;
  exr_result_t eVar1;
  int iVar2;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  exr_context_t nonc;
  exr_attribute_list_t *list;
  exr_result_t eStackY_50;
  undefined8 in_stack_ffffffffffffffb8;
  exr_attribute_t *attr;
  
  if (EXR_COMPRESSION_DWAB < cval) {
    eVar1 = (*ctxt->print_error)
                      (ctxt,4,"\'%s\' value for compression type (%d) out of range (%d - %d)",name,
                       (ulong)cval,0,CONCAT44((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),10));
    return eVar1;
  }
  if ((name != (char *)0x0) && (iVar2 = strcmp(name,"compression"), iVar2 == 0)) {
    eVar1 = exr_set_compression(ctxt,part_index,cval);
    return eVar1;
  }
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar1;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_50 = 0x15;
LAB_0011a036:
    eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,eStackY_50);
    return eVar1;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_50 = 8;
    goto LAB_0011a036;
  }
  list = &ctxt->parts[(uint)part_index]->attributes;
  eVar1 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
  if (eVar1 == 0) {
    if (attr->type != EXR_ATTR_COMPRESSION) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar1 = (*ctxt->print_error)
                        (ctxt,0x10,
                         "\'%s\' requested type \'uc\', but stored attributes is type \'%s\'",name,
                         attr->type_name);
      return eVar1;
    }
  }
  else {
    if (eVar1 != 0xf) goto LAB_0011a0c8;
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return 0xf;
    }
    eVar1 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_COMPRESSION,0,(uint8_t **)0x0,&attr);
    if (eVar1 != 0) goto LAB_0011a0c8;
  }
  (attr->field_6).uc = (uint8_t)cval;
  eVar1 = 0;
LAB_0011a0c8:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_compression (
    exr_context_t     ctxt,
    int               part_index,
    const char*       name,
    exr_compression_t cval)
{
    uint8_t val = (uint8_t) cval;
    if (cval >= EXR_COMPRESSION_LAST_TYPE)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "'%s' value for compression type (%d) out of range (%d - %d)",
            name,
            (int) cval,
            0,
            (int) EXR_COMPRESSION_LAST_TYPE);

    if (name && 0 == strcmp (name, EXR_REQ_COMP_STR))
        return exr_set_compression (ctxt, part_index, cval);

    {
        ATTR_SET_IMPL (EXR_ATTR_COMPRESSION, uc);
    }
}